

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

char * lj_strfmt_wstrnum(lua_State *L,cTValue *o,MSize *lenp)

{
  ulong uVar1;
  SBuf *pSVar2;
  int *in_RDX;
  uint *in_RSI;
  long in_RDI;
  SBuf *sb;
  SBuf *sb_1;
  SFormat in_stack_ffffffffffffffbc;
  SBuf *in_stack_ffffffffffffffc0;
  char *local_20;
  
  if (in_RSI[1] == 0xfffffffb) {
    *in_RDX = *(int *)((ulong)*in_RSI + 0xc);
    local_20 = (char *)((ulong)*in_RSI + 0x10);
  }
  else if (in_RSI[1] < 0xfffeffff) {
    uVar1 = (ulong)*(uint *)(in_RDI + 8);
    *(int *)(uVar1 + 0xf4) = (int)in_RDI;
    *(undefined4 *)(uVar1 + 0xe8) = *(undefined4 *)(uVar1 + 0xf0);
    pSVar2 = lj_strfmt_putfnum(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                               5.82340848849348e-318);
    *in_RDX = (pSVar2->p).ptr32 - (pSVar2->b).ptr32;
    local_20 = (char *)(ulong)(pSVar2->b).ptr32;
  }
  else {
    local_20 = (char *)0x0;
  }
  return local_20;
}

Assistant:

const char *lj_strfmt_wstrnum(lua_State *L, cTValue *o, MSize *lenp)
{
  SBuf *sb;
  if (tvisstr(o)) {
    *lenp = strV(o)->len;
    return strVdata(o);
  } else if (tvisint(o)) {
    sb = lj_strfmt_putint(lj_buf_tmp_(L), intV(o));
  } else if (tvisnum(o)) {
    sb = lj_strfmt_putfnum(lj_buf_tmp_(L), STRFMT_G14, o->n);
  } else {
    return NULL;
  }
  *lenp = sbuflen(sb);
  return sbufB(sb);
}